

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeStencilCompare
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,StencilState *stencilState,int numStencilBits,
          ConstPixelBufferAccess *stencilBuffer)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int maskedBuf_7;
  int maskedRef_7;
  int stencilBufferValue_7;
  Fragment *frag_7;
  int local_110;
  int fragSampleNdx_7;
  int regSampleNdx_7;
  int maskedBuf_6;
  int maskedRef_6;
  int stencilBufferValue_6;
  Fragment *frag_6;
  int local_f0;
  int fragSampleNdx_6;
  int regSampleNdx_6;
  int maskedBuf_5;
  int maskedRef_5;
  int stencilBufferValue_5;
  Fragment *frag_5;
  int local_d0;
  int fragSampleNdx_5;
  int regSampleNdx_5;
  int maskedBuf_4;
  int maskedRef_4;
  int stencilBufferValue_4;
  Fragment *frag_4;
  int local_b0;
  int fragSampleNdx_4;
  int regSampleNdx_4;
  int maskedBuf_3;
  int maskedRef_3;
  int stencilBufferValue_3;
  Fragment *frag_3;
  int local_90;
  int fragSampleNdx_3;
  int regSampleNdx_3;
  int maskedBuf_2;
  int maskedRef_2;
  int stencilBufferValue_2;
  Fragment *frag_2;
  int local_70;
  int fragSampleNdx_2;
  int regSampleNdx_2;
  int maskedBuf_1;
  int maskedRef_1;
  int stencilBufferValue_1;
  Fragment *frag_1;
  int local_50;
  int fragSampleNdx_1;
  int regSampleNdx_1;
  int maskedBuf;
  int maskedRef;
  int stencilBufferValue;
  Fragment *frag;
  int fragSampleNdx;
  int regSampleNdx;
  int clampedStencilRef;
  int numStencilBits_local;
  StencilState *stencilState_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  regSampleNdx._0_1_ = (byte)numStencilBits;
  uVar1 = de::clamp<int>(stencilState->ref,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
  switch(stencilState->func) {
  case TESTFUNC_NEVER:
    for (frag._4_4_ = 0; frag._4_4_ < 0x40; frag._4_4_ = frag._4_4_ + 1) {
      if ((this->m_sampleRegister[frag._4_4_].isAlive & 1U) != 0) {
        iVar2 = tcu::Vector<int,_2>::x
                          (&inputFragments[fragNdxOffset + frag._4_4_ / numSamplesPerFragment].
                            pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y
                          (&inputFragments[fragNdxOffset + frag._4_4_ / numSamplesPerFragment].
                            pixelCoord);
        tcu::ConstPixelBufferAccess::getPixStencil
                  (stencilBuffer,frag._4_4_ % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[frag._4_4_].stencilPassed = false;
      }
    }
    break;
  case TESTFUNC_ALWAYS:
    for (local_50 = 0; local_50 < 0x40; local_50 = local_50 + 1) {
      if ((this->m_sampleRegister[local_50].isAlive & 1U) != 0) {
        iVar2 = tcu::Vector<int,_2>::x
                          (&inputFragments[fragNdxOffset + local_50 / numSamplesPerFragment].
                            pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y
                          (&inputFragments[fragNdxOffset + local_50 / numSamplesPerFragment].
                            pixelCoord);
        tcu::ConstPixelBufferAccess::getPixStencil
                  (stencilBuffer,local_50 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_50].stencilPassed = true;
      }
    }
    break;
  case TESTFUNC_LESS:
    for (local_70 = 0; local_70 < 0x40; local_70 = local_70 + 1) {
      if ((this->m_sampleRegister[local_70].isAlive & 1U) != 0) {
        iVar2 = tcu::Vector<int,_2>::x
                          (&inputFragments[fragNdxOffset + local_70 / numSamplesPerFragment].
                            pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y
                          (&inputFragments[fragNdxOffset + local_70 / numSamplesPerFragment].
                            pixelCoord);
        uVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,local_70 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_70].stencilPassed =
             (int)(stencilState->compMask & uVar1) < (int)(stencilState->compMask & uVar4);
      }
    }
    break;
  case TESTFUNC_LEQUAL:
    for (local_90 = 0; local_90 < 0x40; local_90 = local_90 + 1) {
      if ((this->m_sampleRegister[local_90].isAlive & 1U) != 0) {
        iVar2 = tcu::Vector<int,_2>::x
                          (&inputFragments[fragNdxOffset + local_90 / numSamplesPerFragment].
                            pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y
                          (&inputFragments[fragNdxOffset + local_90 / numSamplesPerFragment].
                            pixelCoord);
        uVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,local_90 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_90].stencilPassed =
             (int)(stencilState->compMask & uVar1) <= (int)(stencilState->compMask & uVar4);
      }
    }
    break;
  case TESTFUNC_GREATER:
    for (local_b0 = 0; local_b0 < 0x40; local_b0 = local_b0 + 1) {
      if ((this->m_sampleRegister[local_b0].isAlive & 1U) != 0) {
        iVar2 = tcu::Vector<int,_2>::x
                          (&inputFragments[fragNdxOffset + local_b0 / numSamplesPerFragment].
                            pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y
                          (&inputFragments[fragNdxOffset + local_b0 / numSamplesPerFragment].
                            pixelCoord);
        uVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,local_b0 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_b0].stencilPassed =
             (int)(stencilState->compMask & uVar4) < (int)(stencilState->compMask & uVar1);
      }
    }
    break;
  case TESTFUNC_GEQUAL:
    for (local_d0 = 0; local_d0 < 0x40; local_d0 = local_d0 + 1) {
      if ((this->m_sampleRegister[local_d0].isAlive & 1U) != 0) {
        iVar2 = tcu::Vector<int,_2>::x
                          (&inputFragments[fragNdxOffset + local_d0 / numSamplesPerFragment].
                            pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y
                          (&inputFragments[fragNdxOffset + local_d0 / numSamplesPerFragment].
                            pixelCoord);
        uVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,local_d0 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_d0].stencilPassed =
             (int)(stencilState->compMask & uVar4) <= (int)(stencilState->compMask & uVar1);
      }
    }
    break;
  case TESTFUNC_EQUAL:
    for (local_f0 = 0; local_f0 < 0x40; local_f0 = local_f0 + 1) {
      if ((this->m_sampleRegister[local_f0].isAlive & 1U) != 0) {
        iVar2 = tcu::Vector<int,_2>::x
                          (&inputFragments[fragNdxOffset + local_f0 / numSamplesPerFragment].
                            pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y
                          (&inputFragments[fragNdxOffset + local_f0 / numSamplesPerFragment].
                            pixelCoord);
        uVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,local_f0 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_f0].stencilPassed =
             (stencilState->compMask & uVar1) == (stencilState->compMask & uVar4);
      }
    }
    break;
  case TESTFUNC_NOTEQUAL:
    for (local_110 = 0; local_110 < 0x40; local_110 = local_110 + 1) {
      if ((this->m_sampleRegister[local_110].isAlive & 1U) != 0) {
        iVar2 = tcu::Vector<int,_2>::x
                          (&inputFragments[fragNdxOffset + local_110 / numSamplesPerFragment].
                            pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y
                          (&inputFragments[fragNdxOffset + local_110 / numSamplesPerFragment].
                            pixelCoord);
        uVar4 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,local_110 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_110].stencilPassed =
             (stencilState->compMask & uVar1) != (stencilState->compMask & uVar4);
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeStencilCompare (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const StencilState& stencilState, int numStencilBits, const tcu::ConstPixelBufferAccess& stencilBuffer)
{
#define SAMPLE_REGISTER_STENCIL_COMPARE(COMPARE_EXPRESSION)																					\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)															\
	{																																		\
		if (m_sampleRegister[regSampleNdx].isAlive)																							\
		{																																	\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;													\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];					\
			int					stencilBufferValue	= stencilBuffer.getPixStencil(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());	\
			int					maskedRef			= stencilState.compMask & clampedStencilRef;											\
			int					maskedBuf			= stencilState.compMask & stencilBufferValue;											\
			DE_UNREF(maskedRef);																											\
			DE_UNREF(maskedBuf);																											\
																																			\
			m_sampleRegister[regSampleNdx].stencilPassed = (COMPARE_EXPRESSION);															\
		}																																	\
	}

	int clampedStencilRef = de::clamp(stencilState.ref, 0, (1<<numStencilBits)-1);

	switch (stencilState.func)
	{
		case TESTFUNC_NEVER:	SAMPLE_REGISTER_STENCIL_COMPARE(false)						break;
		case TESTFUNC_ALWAYS:	SAMPLE_REGISTER_STENCIL_COMPARE(true)						break;
		case TESTFUNC_LESS:		SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef <  maskedBuf)		break;
		case TESTFUNC_LEQUAL:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef <= maskedBuf)		break;
		case TESTFUNC_GREATER:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef >  maskedBuf)		break;
		case TESTFUNC_GEQUAL:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef >= maskedBuf)		break;
		case TESTFUNC_EQUAL:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef == maskedBuf)		break;
		case TESTFUNC_NOTEQUAL:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef != maskedBuf)		break;
		default:
			DE_ASSERT(false);
	}

#undef SAMPLE_REGISTER_STENCIL_COMPARE
}